

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazy_geometry_device.cpp
# Opt level: O3

uint embree::createTriangulatedSphere(RTCScene scene,Vec3fa *p,float r)

{
  int iVar1;
  float fVar2;
  int iVar3;
  uint uVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int theta;
  int iVar10;
  long lVar11;
  float *pfVar12;
  float *pfVar13;
  int iVar14;
  int iVar15;
  float fVar16;
  float fVar17;
  float __x;
  float __x_00;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float phif;
  
  uVar5 = rtcNewGeometry(g_device,0);
  lVar6 = rtcSetNewGeometryBuffer(uVar5,1,0,0x9003,0x10,0x348);
  lVar7 = rtcSetNewGeometryBuffer(uVar5,0,0,0x5003,0xc,0x5f0);
  auVar18._0_12_ = ZEXT812(0x42200000);
  auVar18._12_4_ = 0;
  auVar18 = rcpss(auVar18,ZEXT816(0x42200000));
  auVar19._0_12_ = ZEXT812(0x41a00000);
  auVar19._12_4_ = 0;
  auVar19 = rcpss(auVar19,ZEXT816(0x41a00000));
  pfVar12 = (float *)(lVar6 + 8);
  iVar10 = 0;
  lVar6 = 0;
  iVar15 = 0;
  do {
    __x = (float)(int)lVar6 * 3.1415927 * (2.0 - auVar19._0_4_ * 20.0) * auVar19._0_4_;
    iVar3 = (int)lVar6 * 0x28;
    lVar11 = 0;
    pfVar13 = pfVar12;
    do {
      __x_00 = ((float)(int)lVar11 + (float)(int)lVar11) * 3.1415927 *
               (2.0 - auVar18._0_4_ * 40.0) * auVar18._0_4_;
      fVar2 = (p->field_0).m128[0];
      fVar16 = sinf(__x);
      fVar17 = sinf(__x_00);
      pfVar13[-2] = fVar17 * fVar16 * r + fVar2;
      fVar2 = (p->field_0).m128[1];
      fVar16 = cosf(__x);
      pfVar13[-1] = fVar16 * r + fVar2;
      fVar2 = (p->field_0).m128[2];
      fVar16 = sinf(__x);
      fVar17 = cosf(__x_00);
      *pfVar13 = fVar17 * fVar16 * r + fVar2;
      lVar11 = lVar11 + 1;
      pfVar13 = pfVar13 + 4;
    } while (lVar11 != 0x28);
    if (lVar6 != 0) {
      iVar8 = -0x28;
      do {
        iVar9 = iVar8 + 0x29;
        if (iVar8 == -1) {
          iVar9 = 0;
        }
        iVar1 = iVar9 + iVar3 + -0x28;
        iVar14 = iVar10 + iVar8 + 0x28;
        if (lVar6 == 1) {
LAB_00118ef8:
          lVar11 = (long)iVar15;
          *(int *)(lVar7 + lVar11 * 0xc) = iVar9 + iVar3;
          *(int *)(lVar7 + 4 + lVar11 * 0xc) = iVar1;
          *(int *)(lVar7 + 8 + lVar11 * 0xc) = iVar14;
          iVar15 = iVar15 + 1;
        }
        else {
          lVar11 = (long)iVar15;
          iVar15 = iVar15 + 1;
          *(int *)(lVar7 + lVar11 * 0xc) = iVar14;
          *(int *)(lVar7 + 4 + lVar11 * 0xc) = iVar1;
          *(int *)(lVar7 + 8 + lVar11 * 0xc) = iVar10 + iVar8;
          if (lVar6 != 0x14) goto LAB_00118ef8;
        }
        iVar8 = iVar8 + 1;
      } while (iVar8 != 0);
    }
    lVar6 = lVar6 + 1;
    pfVar12 = pfVar12 + 0xa0;
    iVar10 = iVar10 + 0x28;
    if (lVar6 == 0x15) {
      rtcCommitGeometry(uVar5);
      uVar4 = rtcAttachGeometry(scene,uVar5);
      rtcReleaseGeometry(uVar5);
      return uVar4;
    }
  } while( true );
}

Assistant:

unsigned int createTriangulatedSphere (RTCScene scene, const Vec3fa& p, float r)
{
  /* create triangle mesh */
  RTCGeometry geom = rtcNewGeometry (g_device, RTC_GEOMETRY_TYPE_TRIANGLE);

  /* map triangle and vertex buffers */
  Vertex* vertices = (Vertex*) rtcSetNewGeometryBuffer(geom, RTC_BUFFER_TYPE_VERTEX, 0, RTC_FORMAT_FLOAT3, sizeof(Vertex), numTheta*(numPhi+1));
  Triangle* triangles = (Triangle*) rtcSetNewGeometryBuffer(geom, RTC_BUFFER_TYPE_INDEX, 0, RTC_FORMAT_UINT3, sizeof(Triangle), 2*numTheta*(numPhi-1));

  /* create sphere */
  int tri = 0;
  const float rcpNumTheta = rcp((float)numTheta);
  const float rcpNumPhi   = rcp((float)numPhi);
  for (int phi=0; phi<=numPhi; phi++)
  {
    for (int theta=0; theta<numTheta; theta++)
    {
      const float phif   = phi*float(pi)*rcpNumPhi;
      const float thetaf = theta*2.0f*float(pi)*rcpNumTheta;

      Vertex& v = vertices[phi*numTheta+theta];
      v.x = p.x + r*sin(phif)*sin(thetaf);
      v.y = p.y + r*cos(phif);
      v.z = p.z + r*sin(phif)*cos(thetaf);
    }
    if (phi == 0) continue;

    for (int theta=1; theta<=numTheta; theta++)
    {
      int p00 = (phi-1)*numTheta+theta-1;
      int p01 = (phi-1)*numTheta+theta%numTheta;
      int p10 = phi*numTheta+theta-1;
      int p11 = phi*numTheta+theta%numTheta;

      if (phi > 1) {
        triangles[tri].v0 = p10;
        triangles[tri].v1 = p01;
        triangles[tri].v2 = p00;
        tri++;
      }

      if (phi < numPhi) {
        triangles[tri].v0 = p11;
        triangles[tri].v1 = p01;
        triangles[tri].v2 = p10;
        tri++;
      }
    }
  }

  rtcCommitGeometry(geom);
  unsigned int geomID = rtcAttachGeometry(scene,geom);
  rtcReleaseGeometry(geom);
  return geomID;
}